

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O1

wchar_t lookup_curse(char *name)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong unaff_RBP;
  char **ppcVar4;
  ulong uVar5;
  
  bVar1 = z_info->curse_max;
  if (1 < (ulong)bVar1) {
    ppcVar4 = &curses[1].name;
    uVar5 = 1;
    do {
      bVar2 = true;
      if ((*ppcVar4 != (char *)0x0) && (iVar3 = strcmp(name,*ppcVar4), iVar3 == 0)) {
        bVar2 = false;
        unaff_RBP = uVar5 & 0xffffffff;
      }
      if (!bVar2) {
        return (wchar_t)unaff_RBP;
      }
      uVar5 = uVar5 + 1;
      ppcVar4 = ppcVar4 + 7;
    } while (bVar1 != uVar5);
  }
  return L'\0';
}

Assistant:

int lookup_curse(const char *name)
{
	int i;

	for (i = 1; i < z_info->curse_max; i++) {
		struct curse *curse = &curses[i];
		if (curse->name && streq(name, curse->name))
			return i;
	}
	return 0;
}